

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.c
# Opt level: O3

_Bool testxor8(size_t size)

{
  _Bool _Var1;
  xor8_t filter;
  
  puts("testing xor8");
  _Var1 = test(size,0,&filter,xor8_allocate_gen,xor8_free_gen,xor8_size_in_bytes_gen,
               xor8_serialization_bytes_gen,xor8_serialize_gen,xor8_deserialize_gen,
               xor8_populate_gen,xor8_contain_gen);
  return _Var1;
}

Assistant:

bool testxor8(size_t size) {
  printf("testing xor8\n");
  xor8_t filter;
  return test(size, 0, &filter,
              xor8_allocate_gen,
              xor8_free_gen,
              xor8_size_in_bytes_gen,
              xor8_serialization_bytes_gen,
              xor8_serialize_gen,
              xor8_deserialize_gen,
              xor8_populate_gen,
              xor8_contain_gen);
}